

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O0

void prf_vertex_list_set_list(prf_node_t *node,int count,uint32_t *ptr)

{
  void *in_RDX;
  int in_ESI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_vertex_list_info.opcode) {
    in_RDI[1] = (short)(in_ESI << 2) + 4;
    memcpy(*(void **)(in_RDI + 4),in_RDX,(long)(in_ESI << 2));
  }
  else {
    prf_error(9,"tried vertex_list_set_list() on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

void
prf_vertex_list_set_list(
    prf_node_t * node,
    int count,
    uint32_t * ptr )
{
    assert( node != NULL && ptr != NULL );
    assert( count > 2 && count <= ((node->length - 4) / 4) );

    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex_list_set_list() on node of type %d.",
            node->opcode );
        return;
    }

    node->length = (count * 4) + 4;
    memcpy( node->data, ptr, count * 4 );
}